

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void issue431(void)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *b2;
  roaring_bitmap_t *b1;
  roaring_bitmap_t *in_stack_00000020;
  undefined4 in_stack_00000028;
  uint32_t in_stack_0000002c;
  roaring_bitmap_t *in_stack_00000030;
  uint64_t in_stack_ffffffffffffffe8;
  roaring_bitmap_t *in_stack_fffffffffffffff0;
  
  roaring_bitmap_create();
  roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  roaring_bitmap_flip_inplace(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0x10bcc0);
  r = roaring_bitmap_create();
  roaring_bitmap_add_range(r,in_stack_ffffffffffffffe8,0x10bcde);
  roaring_bitmap_is_subset
            ((roaring_bitmap_t *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000020);
  roaring_bitmap_free((roaring_bitmap_t *)0x10bcf7);
  roaring_bitmap_free((roaring_bitmap_t *)0x10bd01);
  return;
}

Assistant:

DEFINE_TEST(issue431) {
    // This is a memory access test, so we don't need to check the results.
    roaring_bitmap_t *b1 = roaring_bitmap_create();
    roaring_bitmap_add(b1, 100);
    roaring_bitmap_flip_inplace(b1, 0, 100 + 1);
    roaring_bitmap_t *b2 = roaring_bitmap_create();
    roaring_bitmap_add_range(b2, 50, 100 + 1);
    roaring_bitmap_is_subset(b2, b1);
    roaring_bitmap_free(b2);
    roaring_bitmap_free(b1);
}